

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O0

void __thiscall despot::BaseRockSample::PrintState(BaseRockSample *this)

{
  ostream *in_RDX;
  State *in_RSI;
  
  PrintState((BaseRockSample *)
             &this[-1].transition_probabilities_.
              super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,in_RSI,in_RDX);
  return;
}

Assistant:

void BaseRockSample::PrintState(const State& state, ostream& out) const {
	out << endl;
	for (int x = 0; x < size_ + 2; x++)
		out << "# ";
	out << endl;
	for (int y = size_ - 1; y >= 0; y--) {
		out << "# ";
		for (int x = 0; x < size_; x++) {
			Coord pos(x, y);
			int rock = grid_(pos);
			int status = GetRock(&state, rock);
			if (GetRobPos(&state) == Coord(x, y))
				out << "R ";
			else if (rock >= 0)
				out << rock << (status ? "$" : "X");
			else
				out << ". ";
		}
		out << "#" << endl;
	}
	for (int x = 0; x < size_ + 2; x++)
		out << "# ";
	out << endl;
}